

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int mbedtls_entropy_update_seed_file(mbedtls_entropy_context *ctx,char *path)

{
  FILE *__stream;
  size_t sVar1;
  uchar local_438 [8];
  uchar buf [1024];
  size_t n;
  FILE *f;
  int ret;
  char *path_local;
  mbedtls_entropy_context *ctx_local;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    ctx_local._4_4_ = -0x3f;
  }
  else {
    fseek(__stream,0,2);
    buf._1016_8_ = ftell(__stream);
    fseek(__stream,0,0);
    if (0x400 < (ulong)buf._1016_8_) {
      buf[0x3f8] = '\0';
      buf[0x3f9] = '\x04';
      buf[0x3fa] = '\0';
      buf[0x3fb] = '\0';
      buf[0x3fc] = '\0';
      buf[0x3fd] = '\0';
      buf[0x3fe] = '\0';
      buf[0x3ff] = '\0';
    }
    sVar1 = fread(local_438,1,buf._1016_8_,__stream);
    if (sVar1 == buf._1016_8_) {
      f._4_4_ = mbedtls_entropy_update_manual(ctx,local_438,buf._1016_8_);
    }
    else {
      f._4_4_ = -0x3f;
    }
    fclose(__stream);
    mbedtls_platform_zeroize(local_438,0x400);
    if (f._4_4_ == 0) {
      ctx_local._4_4_ = mbedtls_entropy_write_seed_file(ctx,path);
    }
    else {
      ctx_local._4_4_ = f._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_entropy_update_seed_file( mbedtls_entropy_context *ctx, const char *path )
{
    int ret = 0;
    FILE *f;
    size_t n;
    unsigned char buf[ MBEDTLS_ENTROPY_MAX_SEED_SIZE ];

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR );

    fseek( f, 0, SEEK_END );
    n = (size_t) ftell( f );
    fseek( f, 0, SEEK_SET );

    if( n > MBEDTLS_ENTROPY_MAX_SEED_SIZE )
        n = MBEDTLS_ENTROPY_MAX_SEED_SIZE;

    if( fread( buf, 1, n, f ) != n )
        ret = MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR;
    else
        ret = mbedtls_entropy_update_manual( ctx, buf, n );

    fclose( f );

    mbedtls_platform_zeroize( buf, sizeof( buf ) );

    if( ret != 0 )
        return( ret );

    return( mbedtls_entropy_write_seed_file( ctx, path ) );
}